

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O2

Llb_Grp_t * Llb_ManGroupAlloc(Llb_Man_t *pMan)

{
  Llb_Grp_t *Entry;
  Vec_Ptr_t *pVVar1;
  
  Entry = (Llb_Grp_t *)calloc(1,0x38);
  Entry->pMan = pMan;
  pVVar1 = Vec_PtrAlloc(8);
  Entry->vIns = pVVar1;
  pVVar1 = Vec_PtrAlloc(8);
  Entry->vOuts = pVVar1;
  pVVar1 = pMan->vGroups;
  Entry->Id = pVVar1->nSize;
  Vec_PtrPush(pVVar1,Entry);
  return Entry;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Llb_Grp_t * Llb_ManGroupAlloc( Llb_Man_t * pMan )
{
    Llb_Grp_t * p;
    p = ABC_CALLOC( Llb_Grp_t, 1 );
    p->pMan   = pMan;
    p->vIns   = Vec_PtrAlloc( 8 );
    p->vOuts  = Vec_PtrAlloc( 8 );
    p->Id     = Vec_PtrSize( pMan->vGroups );
    Vec_PtrPush( pMan->vGroups, p );
    return p;
}